

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::ReservedNamesTest::getLanguageFeatureName_abi_cxx11_
          (string *__return_storage_ptr__,ReservedNamesTest *this,_language_feature language_feature
          )

{
  allocator<char> local_1e;
  undefined1 local_1d;
  _language_feature local_1c;
  ReservedNamesTest *pRStack_18;
  _language_feature language_feature_local;
  ReservedNamesTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = language_feature;
  pRStack_18 = this;
  this_local = (ReservedNamesTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?!]",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  switch(local_1c) {
  case LANGUAGE_FEATURE_ATOMIC_COUNTER:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"atomic counter");
    break;
  case LANGUAGE_FEATURE_ATTRIBUTE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"attribute");
    break;
  case LANGUAGE_FEATURE_CONSTANT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"constant");
    break;
  case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"function argument name");
    break;
  case LANGUAGE_FEATURE_FUNCTION_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"function name");
    break;
  case LANGUAGE_FEATURE_INPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"input variable");
    break;
  case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"input block instance name");
    break;
  case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"input block member name");
    break;
  case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"input block name");
    break;
  case LANGUAGE_FEATURE_OUTPUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"output variable");
    break;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"output block instance name");
    break;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"output block member name");
    break;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"output block name");
    break;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"shader storage block instance name");
    break;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"shader storage block member name");
    break;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"shader storage block name");
    break;
  case LANGUAGE_FEATURE_SHARED_VARIABLE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"shared variable");
    break;
  case LANGUAGE_FEATURE_STRUCTURE_MEMBER:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"structure member");
    break;
  case LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"structure instance name");
    break;
  case LANGUAGE_FEATURE_STRUCTURE_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"structure name");
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"subroutine function name");
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"subroutine type");
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"subroutine uniform");
    break;
  case LANGUAGE_FEATURE_UNIFORM:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uniform");
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uniform block instance name");
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uniform block member name");
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uniform block name");
    break;
  case LANGUAGE_FEATURE_VARIABLE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"variable");
    break;
  case LANGUAGE_FEATURE_VARYING:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"varying");
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"unknown");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamesTest::getLanguageFeatureName(_language_feature language_feature) const
{
	std::string result = "[?!]";

	switch (language_feature)
	{
	case LANGUAGE_FEATURE_ATOMIC_COUNTER:
		result = "atomic counter";
		break;
	case LANGUAGE_FEATURE_ATTRIBUTE:
		result = "attribute";
		break;
	case LANGUAGE_FEATURE_CONSTANT:
		result = "constant";
		break;
	case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
		result = "function argument name";
		break;
	case LANGUAGE_FEATURE_FUNCTION_NAME:
		result = "function name";
		break;
	case LANGUAGE_FEATURE_INPUT:
		result = "input variable";
		break;
	case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
		result = "input block instance name";
		break;
	case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
		result = "input block member name";
		break;
	case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
		result = "input block name";
		break;
	case LANGUAGE_FEATURE_OUTPUT:
		result = "output variable";
		break;
	case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
		result = "output block instance name";
		break;
	case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
		result = "output block member name";
		break;
	case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
		result = "output block name";
		break;
	case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
		result = "shader storage block instance name";
		break;
	case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
		result = "shader storage block member name";
		break;
	case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
		result = "shader storage block name";
		break;
	case LANGUAGE_FEATURE_SHARED_VARIABLE:
		result = "shared variable";
		break;
	case LANGUAGE_FEATURE_STRUCTURE_MEMBER:
		result = "structure member";
		break;
	case LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME:
		result = "structure instance name";
		break;
	case LANGUAGE_FEATURE_STRUCTURE_NAME:
		result = "structure name";
		break;
	case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
		result = "subroutine function name";
		break;
	case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
		result = "subroutine type";
		break;
	case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
		result = "subroutine uniform";
		break;
	case LANGUAGE_FEATURE_UNIFORM:
		result = "uniform";
		break;
	case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
		result = "uniform block instance name";
		break;
	case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
		result = "uniform block member name";
		break;
	case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
		result = "uniform block name";
		break;
	case LANGUAGE_FEATURE_VARIABLE:
		result = "variable";
		break;
	case LANGUAGE_FEATURE_VARYING:
		result = "varying";
		break;
	default:
		result = "unknown";
		break;
	} /* switch (language_feature) */

	return result;
}